

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O0

void print_summary(fitsfile *infits,FILE *out,FitsHdu *hduptr)

{
  int iVar1;
  size_t sVar2;
  int *in_RDX;
  int hdutype;
  long npix;
  char extnv [71];
  char extver [10];
  int i;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  char local_78 [82];
  char local_26 [10];
  int local_1c;
  int *local_18;
  
  local_1c = 0;
  local_18 = in_RDX;
  set_hduerr(0);
  iVar1 = *local_18;
  sprintf(comm," %d header keywords",(ulong)(uint)local_18[0x26]);
  wrtout((FILE *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
         in_stack_ffffffffffffff68);
  wrtout((FILE *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
         in_stack_ffffffffffffff68);
  if ((iVar1 == 1) || (iVar1 == 2)) {
    sprintf(local_78,"%s",local_18 + 0xd);
    if (local_18[0x1f] != -999) {
      sprintf(local_26,"(%d)",(ulong)(uint)local_18[0x1f]);
      strcat(local_78,local_26);
    }
    sprintf(comm," %s  (%d columns x %lld rows)",local_78,(ulong)(uint)local_18[0xc],
            *(undefined8 *)(*(long *)(local_18 + 10) + 8));
    wrtout((FILE *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
           in_stack_ffffffffffffff68);
    if (local_18[0xc] != 0) {
      wrtout((FILE *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
      sprintf(comm," Col# Name (Units)       Format");
      wrtout((FILE *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
    }
    for (local_1c = 0; local_1c < local_18[0xc]; local_1c = local_1c + 1) {
      sVar2 = strlen(tunit[local_1c]);
      if (sVar2 == 0) {
        sprintf(local_78,"%s",ttype[local_1c]);
      }
      else {
        sprintf(local_78,"%s (%s)",ttype[local_1c],tunit[local_1c]);
      }
      sprintf(comm," %3d %-20.20s %-10.10s",(ulong)(local_1c + 1),local_78,tform[local_1c]);
      wrtout((FILE *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
    }
  }
  else if ((iVar1 == 0) && (local_18[2] != 0)) {
    sprintf(comm," %d Random Groups, ",(ulong)(uint)local_18[4]);
    iVar1 = local_18[8];
    if (iVar1 == -0x40) {
      strcpy(temp," 64-bit double precision pixels, ");
    }
    else if (iVar1 == -0x20) {
      strcpy(temp," 32-bit floating point pixels, ");
    }
    else if (iVar1 == 8) {
      strcpy(temp," 8-bit integer pixels, ");
    }
    else if (iVar1 == 0x10) {
      strcpy(temp," 16-bit integer pixels, ");
    }
    else if (iVar1 == 0x14) {
      strcpy(temp," 16-bit unsigned integer pixels, ");
    }
    else if (iVar1 == 0x20) {
      strcpy(temp," 32-bit integer pixels, ");
    }
    else if (iVar1 == 0x28) {
      strcpy(temp," 32-bit unsigned integer pixels, ");
    }
    else if (iVar1 == 0x40) {
      strcpy(temp," 64-bit long integer pixels, ");
    }
    else {
      strcpy(temp," unknown datatype, ");
    }
    strcat(comm,temp);
    sprintf(temp," %d axes ",(ulong)(uint)local_18[9]);
    strcat(comm,temp);
    sprintf(temp,"(%lld",**(undefined8 **)(local_18 + 10));
    strcat(comm,temp);
    for (local_1c = 1; local_1c < local_18[9]; local_1c = local_1c + 1) {
      sprintf(temp," x %lld",*(undefined8 *)(*(long *)(local_18 + 10) + (long)local_1c * 8));
      strcat(comm,temp);
    }
    strcat(comm,"), ");
    wrtout((FILE *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
           in_stack_ffffffffffffff68);
  }
  else if (iVar1 == 0) {
    if (local_18[9] < 1) {
      sprintf(comm," Null data array; NAXIS = 0 ");
      wrtout((FILE *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
    }
    else {
      if (local_18[1] == 1) {
        strcpy(local_78,"");
      }
      else {
        sprintf(local_78,"%s",local_18 + 0xd);
        if (local_18[0x1f] != -999) {
          sprintf(local_26," (%d)",(ulong)(uint)local_18[0x1f]);
          strcat(local_78,local_26);
        }
      }
      strcpy(comm,local_78);
      in_stack_ffffffffffffff74 = local_18[8];
      if (in_stack_ffffffffffffff74 == -0x40) {
        strcpy(temp," 64-bit double precision pixels, ");
      }
      else if (in_stack_ffffffffffffff74 == -0x20) {
        strcpy(temp," 32-bit floating point pixels, ");
      }
      else if (in_stack_ffffffffffffff74 == 8) {
        strcpy(temp," 8-bit integer pixels, ");
      }
      else if (in_stack_ffffffffffffff74 == 0x10) {
        strcpy(temp," 16-bit integer pixels, ");
      }
      else if (in_stack_ffffffffffffff74 == 0x14) {
        strcpy(temp," 16-bit unsigned integer pixels, ");
      }
      else if (in_stack_ffffffffffffff74 == 0x20) {
        strcpy(temp," 32-bit integer pixels, ");
      }
      else if (in_stack_ffffffffffffff74 == 0x28) {
        strcpy(temp," 32-bit unsigned integer pixels, ");
      }
      else if (in_stack_ffffffffffffff74 == 0x40) {
        strcpy(temp," 64-bit long integer pixels, ");
      }
      else {
        strcpy(temp," unknown datatype, ");
      }
      strcat(comm,temp);
      sprintf(temp," %d axes ",(ulong)(uint)local_18[9]);
      strcat(comm,temp);
      sprintf(temp,"(%lld",**(undefined8 **)(local_18 + 10));
      strcat(comm,temp);
      for (local_1c = 1; local_1c < local_18[9]; local_1c = local_1c + 1) {
        sprintf(temp," x %lld",*(undefined8 *)(*(long *)(local_18 + 10) + (long)local_1c * 8));
        strcat(comm,temp);
      }
      strcat(comm,"), ");
      wrtout((FILE *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
    }
  }
  wrtout((FILE *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
         in_stack_ffffffffffffff68);
  return;
}

Assistant:

void print_summary(fitsfile *infits, 	/* input fits file   */ 
	     FILE*	out,		/* output ascii file */
             FitsHdu *hduptr 
            ) 
{ 
   
    int i = 0;
    char extver[10];
    char extnv[FLEN_VALUE];
    long npix;
    int hdutype;

    /* get the error number and wrn number */ 
    set_hduerr(hduptr->hdunum);

    hdutype = hduptr->hdutype;
    sprintf(comm," %d header keywords", hduptr->nkeys);
    wrtout(out,comm);
    wrtout(out," ");
    if(hdutype == ASCII_TBL || hdutype== BINARY_TBL) {  
        sprintf(extnv, "%s",hduptr->extname);
        if (hduptr->extver!=-999) {
            sprintf(extver,"(%d)",hduptr->extver);
            strcat(extnv,extver);
        }

#if (USE_LL_SUFFIX == 1)
        sprintf(comm," %s  (%d columns x %lld rows)", extnv, hduptr->ncols,
           hduptr->naxes[1]);
#else
        sprintf(comm," %s  (%d columns x %ld rows)", extnv, hduptr->ncols,
           hduptr->naxes[1]);
#endif
        wrtout(out,comm);
        if(hduptr->ncols) {
           wrtout(out," ");
           sprintf(comm, " Col# Name (Units)       Format"); 
           wrtout(out,comm);
	}    
        for ( i = 0; i < hduptr->ncols; i++) {
           if(strlen(tunit[i]))  
               sprintf(extnv,"%s (%s)",ttype[i],tunit[i]); 
           else 
               sprintf(extnv,"%s",ttype[i]); 
 	   sprintf(comm," %3d %-20.20s %-10.10s",
              i+1, extnv, tform[i]);
	   wrtout(out,comm);
        }  
    }      
    else if(hdutype == IMAGE_HDU && hduptr->isgroup) { 

            sprintf(comm, " %d Random Groups, ",hduptr->gcount);

            switch(hduptr->bitpix) { 
            	case BYTE_IMG: 
               	    strcpy(temp," 8-bit integer pixels, ");
               	    break; 
                case SHORT_IMG: 
                   strcpy(temp," 16-bit integer pixels, ");
                   break; 
                case USHORT_IMG: 
                   strcpy(temp," 16-bit unsigned integer pixels, ");
                   break; 
                case LONG_IMG: 
                   strcpy(temp," 32-bit integer pixels, ");
                   break; 
                case LONGLONG_IMG: 
                   strcpy(temp," 64-bit long integer pixels, ");
                   break; 
                case ULONG_IMG: 
                   strcpy(temp," 32-bit unsigned integer pixels, ");
                   break; 
                case FLOAT_IMG: 
                   strcpy(temp," 32-bit floating point pixels, ");
                   break; 
                case DOUBLE_IMG: 
                   strcpy(temp," 64-bit double precision pixels, ");
                   break; 
                default: 
                   strcpy(temp," unknown datatype, ");
                   break; 
            }
	    strcat(comm,temp);

            sprintf(temp," %d axes ",hduptr->naxis);
	    strcat(comm,temp);

#if (USE_LL_SUFFIX == 1)
	    sprintf(temp, "(%lld",hduptr->naxes[0]);
#else
	    sprintf(temp, "(%ld",hduptr->naxes[0]);
#endif
	    strcat(comm,temp);

	    npix = hduptr->naxes[0];
	    for ( i = 1; i < hduptr->naxis; i++){ 
	       npix *= hduptr->naxes[i];
#if (USE_LL_SUFFIX == 1)
	       sprintf(temp, " x %lld",hduptr->naxes[i]);
#else
	       sprintf(temp, " x %ld",hduptr->naxes[i]);
#endif
	       strcat(comm,temp);
            }  
	    strcat(comm,"), ");
            wrtout(out,comm);
    }
    else if(hdutype == IMAGE_HDU) { 
        if(hduptr->naxis > 0) {

	    if(hduptr->hdunum == 1) {  
                strcpy(extnv,"");
            } else { 
                sprintf(extnv, "%s",hduptr->extname);
                if (hduptr->extver!=-999) {
                   sprintf(extver," (%d)",hduptr->extver);
                   strcat(extnv,extver);
                }
            }
	    strcpy(comm,extnv);

            switch(hduptr->bitpix) { 
            	case BYTE_IMG: 
               	    strcpy(temp," 8-bit integer pixels, ");
               	    break; 
                case SHORT_IMG: 
                   strcpy(temp," 16-bit integer pixels, ");
                   break; 
                case USHORT_IMG: 
                   strcpy(temp," 16-bit unsigned integer pixels, ");
                   break; 
                case LONG_IMG: 
                   strcpy(temp," 32-bit integer pixels, ");
                   break; 
                case LONGLONG_IMG: 
                   strcpy(temp," 64-bit long integer pixels, ");
                   break; 
                case ULONG_IMG: 
                   strcpy(temp," 32-bit unsigned integer pixels, ");
                   break; 
                case FLOAT_IMG: 
                   strcpy(temp," 32-bit floating point pixels, ");
                   break; 
                case DOUBLE_IMG: 
                   strcpy(temp," 64-bit double precision pixels, ");
                   break; 
                default: 
                   strcpy(temp," unknown datatype, ");
                   break; 
            }
	    strcat(comm,temp);

            sprintf(temp," %d axes ",hduptr->naxis);
	    strcat(comm,temp);

#if (USE_LL_SUFFIX == 1)
	    sprintf(temp, "(%lld",hduptr->naxes[0]);
#else
	    sprintf(temp, "(%ld",hduptr->naxes[0]);
#endif
	    strcat(comm,temp);

	    npix = hduptr->naxes[0];
	    for ( i = 1; i < hduptr->naxis; i++){ 
	       npix *= hduptr->naxes[i];
#if (USE_LL_SUFFIX == 1)
	       sprintf(temp, " x %lld",hduptr->naxes[i]);
#else
	       sprintf(temp, " x %ld",hduptr->naxes[i]);
#endif
	       strcat(comm,temp);
            }  
	    strcat(comm,"), ");
            wrtout(out,comm);
        }
        else{ 
            sprintf(comm," Null data array; NAXIS = 0 ");
            wrtout(out,comm);
        }       
    }
    wrtout(out," ");
    return;
}